

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O3

UBool __thiscall icu_63::NumberFormat::operator==(NumberFormat *this,Format *that)

{
  UBool UVar1;
  int32_t iVar2;
  NumberFormat *other;
  
  if (this == (NumberFormat *)that) {
    return '\x01';
  }
  UVar1 = Format::operator==(&this->super_Format,that);
  if ((((((UVar1 != '\0') &&
         (*(int *)&(this->super_Format).field_0x144 == *(int *)&that->field_0x144)) &&
        (this->fMinIntegerDigits == *(int *)&that[1].super_UObject._vptr_UObject)) &&
       ((this->fMaxFractionDigits == *(int *)((long)&that[1].super_UObject._vptr_UObject + 4) &&
        (this->fMinFractionDigits == *(int *)that[1].actualLocale)))) &&
      (((this->super_Format).field_0x142 == that->field_0x142 &&
       ((this->fParseIntegerOnly == that[1].actualLocale[4] &&
        (iVar2 = u_strcmp_63(this->fCurrency,(UChar *)(that[1].actualLocale + 6)), iVar2 == 0))))))
     && (this->fLenient == that[1].actualLocale[5])) {
    return this->fCapitalizationContext == *(UDisplayContext *)(that[1].actualLocale + 0x10);
  }
  return '\0';
}

Assistant:

UBool
NumberFormat::operator==(const Format& that) const
{
    // Format::operator== guarantees this cast is safe
    NumberFormat* other = (NumberFormat*)&that;

#ifdef FMT_DEBUG
    // This code makes it easy to determine why two format objects that should
    // be equal aren't.
    UBool first = TRUE;
    if (!Format::operator==(that)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("Format::!=");
    }
    if (!(fMaxIntegerDigits == other->fMaxIntegerDigits &&
          fMinIntegerDigits == other->fMinIntegerDigits)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("Integer digits !=");
    }
    if (!(fMaxFractionDigits == other->fMaxFractionDigits &&
          fMinFractionDigits == other->fMinFractionDigits)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("Fraction digits !=");
    }
    if (!(fGroupingUsed == other->fGroupingUsed)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("fGroupingUsed != ");
    }
    if (!(fParseIntegerOnly == other->fParseIntegerOnly)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("fParseIntegerOnly != ");
    }
    if (!(u_strcmp(fCurrency, other->fCurrency) == 0)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("fCurrency !=");
    }
    if (!(fLenient == other->fLenient)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("fLenient != ");
    }
    if (!(fCapitalizationContext == other->fCapitalizationContext)) {
        if (first) { printf("[ "); first = FALSE; } else { printf(", "); }
        debug("fCapitalizationContext != ");
    }
    if (!first) { printf(" ]"); }
#endif

    return ((this == &that) ||
            ((Format::operator==(that) &&
              fMaxIntegerDigits == other->fMaxIntegerDigits &&
              fMinIntegerDigits == other->fMinIntegerDigits &&
              fMaxFractionDigits == other->fMaxFractionDigits &&
              fMinFractionDigits == other->fMinFractionDigits &&
              fGroupingUsed == other->fGroupingUsed &&
              fParseIntegerOnly == other->fParseIntegerOnly &&
              u_strcmp(fCurrency, other->fCurrency) == 0 &&
              fLenient == other->fLenient &&
              fCapitalizationContext == other->fCapitalizationContext)));
}